

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhexview.cpp
# Opt level: O1

void __thiscall QHexView::calcColumns(QHexView *this)

{
  QList<QRectF> *this_00;
  qreal qVar1;
  uint uVar2;
  uint uVar3;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  qreal qVar4;
  QRectF local_78;
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  
  if (this->m_hexdocument != (QHexDocument *)0x0) {
    this_00 = &this->m_hexcolumns;
    QList<QRectF>::clear(this_00);
    QList<QRectF>::reserve(this_00,(ulong)(this->m_options).linelength);
    qVar4 = hexColumnX(this);
    qVar1 = cellWidth(this);
    if ((this->m_options).linelength != 0) {
      uVar2 = 0;
      local_48._8_4_ = extraout_XMM0_Dc;
      local_48._0_8_ = qVar1 + qVar1;
      local_48._12_4_ = extraout_XMM0_Dd;
      local_58._8_4_ = SUB84((double)(int)(double)CONCAT44(extraout_XMM0_Dd,extraout_XMM0_Dc),0);
      local_58._0_8_ = (double)(int)(qVar1 + qVar1);
      local_58._12_4_ =
           (int)((ulong)(double)(int)(double)CONCAT44(extraout_XMM0_Dd,extraout_XMM0_Dc) >> 0x20);
      do {
        if ((this->m_options).grouplength != 0) {
          uVar3 = 0;
          do {
            local_78.xp = (qreal)(int)qVar4;
            local_78.yp = 0.0;
            local_78.w = (qreal)local_58._0_8_;
            local_78.h = 0.0;
            QtPrivate::QMovableArrayOps<QRectF>::emplace<QRectF>
                      ((QMovableArrayOps<QRectF> *)this_00,(this->m_hexcolumns).d.size,&local_78);
            uVar3 = uVar3 + 1;
            qVar4 = qVar4 + (double)local_48._0_8_;
          } while (uVar3 < (this->m_options).grouplength);
        }
        qVar1 = cellWidth(this);
        qVar4 = qVar4 + qVar1;
        uVar2 = uVar2 + 1;
      } while (uVar2 < (this->m_options).linelength);
    }
  }
  return;
}

Assistant:

void QHexView::calcColumns() {
    if(!m_hexdocument)
        return;

    m_hexcolumns.clear();
    m_hexcolumns.reserve(m_options.linelength);

    auto x = this->hexColumnX(), cw = this->cellWidth() * 2;

    for(auto i = 0u; i < m_options.linelength; i++) {
        for(auto j = 0u; j < m_options.grouplength; j++, x += cw)
            m_hexcolumns.push_back(QRect(x, 0, cw, 0));

        x += this->cellWidth();
    }
}